

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_rms_norm_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,float eps)

{
  ggml_tensor *params;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  undefined4 in_XMM0_Da;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  params = ggml_dup_tensor((ggml_context *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffd8);
  ggml_set_op_params((ggml_tensor *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),params,0x14ca0f);
  params->op = GGML_OP_RMS_NORM_BACK;
  params->src[0] = in_RSI;
  params->src[1] = in_RDX;
  return params;
}

Assistant:

struct ggml_tensor * ggml_rms_norm_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        float                 eps) {
    struct ggml_tensor * result = ggml_dup_tensor(ctx, a);

    ggml_set_op_params(result, &eps, sizeof(eps));

    result->op     = GGML_OP_RMS_NORM_BACK;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}